

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c++
# Opt level: O2

Array<unsigned_char> *
kj::anon_unknown_74::readAll
          (Array<unsigned_char> *__return_storage_ptr__,InputStream *input,uint64_t limit,
          bool nulTerminate)

{
  size_t sVar1;
  RemoveConst<kj::Array<unsigned_char>_> *pRVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined7 in_register_00000009;
  Array<unsigned_char> *p;
  Array<unsigned_char> *pAVar4;
  uchar *puVar5;
  uint64_t count;
  byte *pos;
  Array<unsigned_char> *local_c8;
  undefined4 local_bc;
  Array<unsigned_char> part;
  Fault f_1;
  uint64_t limit_local;
  DebugComparison<unsigned_long_&,_int> _kjCondition;
  Vector<kj::Array<unsigned_char>_> parts;
  ulong __n;
  
  parts.builder.endPtr = (Array<unsigned_char> *)0x0;
  parts.builder.ptr = (Array<unsigned_char> *)0x0;
  parts.builder.pos = (RemoveConst<kj::Array<unsigned_char>_> *)0x0;
  parts.builder.disposer = (ArrayDisposer *)&NullArrayDisposer::instance;
  local_bc = (undefined4)CONCAT71(in_register_00000009,nulTerminate);
  local_c8 = __return_storage_ptr__;
  limit_local = limit;
  do {
    _kjCondition._8_8_ = _kjCondition._8_8_ & 0xffffffff00000000;
    _kjCondition.op.content.ptr = " > ";
    _kjCondition.op.content.size_ = 4;
    _kjCondition.result = limit_local != 0;
    _kjCondition.left = &limit_local;
    if (limit_local == 0) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long&,int>&,char_const(&)[26]>
                ((Fault *)&part,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/io.c++"
                 ,0x4e,FAILED,"limit > 0","_kjCondition,\"Reached limit before EOF.\"",&_kjCondition
                 ,(char (*) [26])"Reached limit before EOF.");
      kj::_::Debug::Fault::fatal((Fault *)&part);
    }
    count = limit_local;
    if (0xfff < limit_local) {
      count = 0x1000;
    }
    part.ptr = kj::_::HeapArrayDisposer::allocate<unsigned_char>(count);
    part.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
    part.size_ = count;
    iVar3 = (*input->_vptr_InputStream[2])(input,part.ptr,count);
    sVar1 = part.size_;
    __n = CONCAT44(extraout_var,iVar3);
    limit_local = limit_local - __n;
    if (__n < part.size_) {
      heapArray<unsigned_char>
                (__return_storage_ptr__,
                 (CONCAT71(in_register_00000009,nulTerminate) & 0xffffffff) + __n +
                 (((long)parts.builder.pos - (long)parts.builder.ptr) / 0x18) * 0x1000);
      pRVar2 = parts.builder.pos;
      pos = __return_storage_ptr__->ptr;
      for (pAVar4 = parts.builder.ptr; puVar5 = pos + 0x1000, pAVar4 != pRVar2; pAVar4 = pAVar4 + 1)
      {
        memcpy(pos,pAVar4->ptr,0x1000);
        pos = puVar5;
      }
      memcpy(pos,part.ptr,__n);
      puVar5 = pos + __n;
      pos = puVar5;
      if ((char)local_bc != '\0') {
        pos = puVar5 + 1;
        *puVar5 = '\0';
      }
      _kjCondition._8_8_ = local_c8->ptr + local_c8->size_;
      _kjCondition.left = (unsigned_long *)&pos;
      _kjCondition.op.content.ptr = " == ";
      _kjCondition.op.content.size_ = 5;
      _kjCondition.result = pos == (byte *)_kjCondition._8_8_;
      __return_storage_ptr__ = local_c8;
      if (!_kjCondition.result) {
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_char*&,unsigned_char*>&>
                  (&f_1,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/io.c++"
                   ,0x5c,FAILED,"pos == result.end()","_kjCondition,",
                   (DebugComparison<unsigned_char_*&,_unsigned_char_*> *)&_kjCondition);
        kj::_::Debug::Fault::fatal(&f_1);
      }
    }
    else {
      Vector<kj::Array<unsigned_char>>::add<kj::Array<unsigned_char>>
                ((Vector<kj::Array<unsigned_char>> *)&parts,&part);
    }
    Array<unsigned_char>::~Array(&part);
    if (__n < sVar1) {
      ArrayBuilder<kj::Array<unsigned_char>_>::dispose(&parts.builder);
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

Array<byte> readAll(InputStream& input, uint64_t limit, bool nulTerminate) {
  Vector<Array<byte>> parts;
  constexpr size_t BLOCK_SIZE = 4096;

  for (;;) {
    KJ_REQUIRE(limit > 0, "Reached limit before EOF.");
    auto part = heapArray<byte>(kj::min(BLOCK_SIZE, limit));
    size_t n = input.tryRead(part, part.size());
    limit -= n;
    if (n < part.size()) {
      auto result = heapArray<byte>(parts.size() * BLOCK_SIZE + n + nulTerminate);
      byte* pos = result.begin();
      for (auto& p: parts) {
        memcpy(pos, p.begin(), BLOCK_SIZE);
        pos += BLOCK_SIZE;
      }
      memcpy(pos, part.begin(), n);
      pos += n;
      if (nulTerminate) *pos++ = '\0';
      KJ_ASSERT(pos == result.end());
      return result;
    } else {
      parts.add(kj::mv(part));
    }
  }
}